

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O3

bool __thiscall CGraphics_Threaded::SetVSync(CGraphics_Threaded *this,bool State)

{
  CCommandBuffer *pCVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  CVSyncCommand Cmd;
  bool RetOk;
  CVSyncCommand local_40;
  bool local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.m_pRetOk = &local_19;
  local_19 = false;
  local_40.super_CCommand.m_Cmd = 9;
  local_40.super_CCommand.m_pNext = (CCommand *)0x0;
  local_40.m_VSync = (int)CONCAT71(in_register_00000031,State);
  CCommandBuffer::AddCommand<CCommandBuffer::CVSyncCommand>(this->m_pCommandBuffer,&local_40);
  (*this->m_pBackend->_vptr_IGraphicsBackend[0x11])(this->m_pBackend,this->m_pCommandBuffer);
  uVar2 = (ulong)this->m_CurrentCommandBuffer ^ 1;
  this->m_CurrentCommandBuffer = (uint)uVar2;
  pCVar1 = this->m_apCommandBuffers[uVar2];
  this->m_pCommandBuffer = pCVar1;
  (pCVar1->m_CmdBuffer).m_Used = 0;
  *(undefined8 *)&(pCVar1->m_DataBuffer).m_Used = 0;
  *(undefined8 *)((long)&pCVar1->m_pCmdBufferHead + 4) = 0;
  *(undefined4 *)((long)&pCVar1->m_pCmdBufferTail + 4) = 0;
  (**(code **)(*(long *)this + 0x150))(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool CGraphics_Threaded::SetVSync(bool State)
{
	// add vsnc command
	bool RetOk = 0;
	CCommandBuffer::CVSyncCommand Cmd;
	Cmd.m_VSync = State ? 1 : 0;
	Cmd.m_pRetOk = &RetOk;
	m_pCommandBuffer->AddCommand(Cmd);

	// kick the command buffer
	KickCommandBuffer();
	WaitForIdle();
	return RetOk;
}